

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::rpc_session::handle_handshake(rpc_session *this,ptr<rpc_session> *self,error_code *err)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  uint64_t uVar4;
  __shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  undefined1 local_90 [24];
  __shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  pointer local_68;
  ptr<asio::steady_timer> timer;
  __shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (err->_M_value == 0) {
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (3 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_90,"session %lu handshake with %s:%u succeeded (as a server)",
                   this->session_id_,(this->cached_address_)._M_dataplus._M_p,
                   (ulong)this->cached_port_);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x11e,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
      }
    }
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)
    ;
    start(this,(ptr<rpc_session> *)&local_40);
    p_Var5 = &local_40;
  }
  else {
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (1 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar4 = this->session_id_;
        local_68 = (this->cached_address_)._M_dataplus._M_p;
        uVar1 = this->cached_port_;
        uVar2 = err->_M_value;
        (**(code **)(*(long *)err->_M_cat + 0x20))(&timer,err->_M_cat,uVar2);
        msg_if_given_abi_cxx11_
                  ((string *)local_90,"session %lu handshake with %s:%u failed: error %d, %s",uVar4,
                   local_68,(ulong)uVar1,(ulong)uVar2,
                   timer.
                   super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x127,local_90);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)&timer);
      }
    }
    std::
    make_shared<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
              ((io_context *)&timer);
    local_90._0_8_ = (pointer)0x1dcd6500;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after(timer.
                    super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(duration *)local_90);
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)local_90,
               &self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>);
    local_90._16_8_ = this;
    std::
    __shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_78,
                   &timer.
                    super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                  );
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
    ::
    async_wait<nuraft::rpc_session::handle_handshake(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)::_lambda(std::error_code_const&)_1_>
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
                *)timer.
                  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,(anon_class_40_3_33732ff9 *)local_90);
    handle_handshake(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)::
    {lambda(std::error_code_const&)#1}::~error_code((_lambda_std__error_code_const___1_ *)local_90);
    p_Var5 = (__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)
             &timer.
              super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var5->_M_refcount);
  return;
}

Assistant:

void handle_handshake(ptr<rpc_session> self,
                          const ERROR_CODE& err) {
        if (!err) {
            p_in( "session %" PRIu64 " handshake with %s:%u succeeded (as a server)",
                  session_id_,
                  cached_address_.c_str(),
                  cached_port_ );
            this->start(self);

        } else {
            p_er( "session %" PRIu64 " handshake with %s:%u failed: error %d, %s",
                  session_id_,
                  cached_address_.c_str(),
                  cached_port_,
                  err.value(),
                  err.message().c_str() );

            // Lazy stop.
            ptr<asio::steady_timer> timer =
                cs_new<asio::steady_timer>(impl_->get_io_svc());
            timer->expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( SSL_GRACE_PERIOD_MS ) ) );
            timer->async_wait( [self, this, timer]
                               (const ERROR_CODE& err) -> void
            {
                if (err) {
                    p_er("session %" PRIu64 " error happend during "
                         "async wait: %d, %s",
                         session_id_,
                         err.value(),
                         err.message().c_str());
                }
                this->stop();
            });
        }
    }